

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

int faidx_has_seq(faidx_t *fai,char *seq)

{
  khint_t kVar1;
  uint uVar2;
  kh_s_t *pkVar3;
  khint32_t *pkVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  pkVar3 = fai->hash;
  kVar1 = pkVar3->n_buckets;
  if (kVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar10 = (uint)*seq;
    if (*seq == '\0') {
      uVar10 = 0;
    }
    else {
      cVar5 = seq[1];
      if (cVar5 != '\0') {
        pcVar9 = seq + 2;
        do {
          uVar10 = (int)cVar5 + uVar10 * 0x1f;
          cVar5 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar5 != '\0');
      }
    }
    uVar10 = uVar10 & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar12 = 1;
    uVar11 = uVar10;
    do {
      uVar2 = pkVar4[uVar11 >> 4];
      bVar8 = (char)uVar11 * '\x02' & 0x1e;
      uVar6 = uVar2 >> bVar8;
      if (((uVar6 & 2) != 0) ||
         (((uVar6 & 1) == 0 && (iVar7 = strcmp(pkVar3->keys[uVar11],seq), iVar7 == 0)))) {
        uVar6 = uVar11;
        if ((uVar2 >> bVar8 & 3) != 0) {
          uVar6 = kVar1;
        }
        break;
      }
      uVar11 = uVar11 + iVar12 & kVar1 - 1;
      iVar12 = iVar12 + 1;
      uVar6 = kVar1;
    } while (uVar11 != uVar10);
  }
  return (int)(uVar6 != kVar1);
}

Assistant:

int faidx_has_seq(const faidx_t *fai, const char *seq)
{
    khiter_t iter = kh_get(s, fai->hash, seq);
    if (iter == kh_end(fai->hash)) return 0;
    return 1;
}